

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O0

transport_protocol * init_tls(void)

{
  int iVar1;
  char local_98 [8];
  char hostname_1 [64];
  char hostname [64];
  transport_protocol *tp;
  
  tp = (transport_protocol *)malloc(0x20);
  if (tp == (transport_protocol *)0x0) {
    gethostname(hostname_1 + 0x38,0x40);
    fprintf(_stderr,"[%s] ",hostname_1 + 0x38);
    fprintf(_stderr,"Failed to alloc transport_protocol\n");
    tp = (transport_protocol *)0x0;
  }
  else {
    tp->tp_main[0] = throughput_ssl_main;
    tp->tp_main[1] = latency_ssl_main;
    tp->tp_main[2] = symmetric_nic_ssl_main;
    tp->tp_main[3] = symmetric_ssl_main;
    iVar1 = ssl_init();
    if (iVar1 != 0) {
      gethostname(local_98,0x40);
      fprintf(_stderr,"[%s] ",local_98);
      fprintf(_stderr,"Failed to initate TLS\n");
      tp = (transport_protocol *)0x0;
    }
  }
  return tp;
}

Assistant:

struct transport_protocol *init_tls(void)
{
	struct transport_protocol *tp;

	tp = malloc(sizeof(struct transport_protocol));
	if (!tp) {
		lancet_fprintf(stderr, "Failed to alloc transport_protocol\n");
		return NULL;
	}

	tp->tp_main[THROUGHPUT_AGENT] = throughput_ssl_main;
	tp->tp_main[LATENCY_AGENT] = latency_ssl_main;
	tp->tp_main[SYMMETRIC_NIC_TIMESTAMP_AGENT] = symmetric_nic_ssl_main;
	tp->tp_main[SYMMETRIC_AGENT] = symmetric_ssl_main;

	if (ssl_init()) {
		lancet_fprintf(stderr, "Failed to initate TLS\n");
		return NULL;
	}

	return tp;
}